

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void do_test_pre_shared_key(int mode)

{
  int iVar1;
  ptls_t *tls;
  ptls_t *tls_00;
  size_t sVar2;
  size_t local_3e0;
  size_t consumed;
  undefined1 auStack_3d0 [4];
  int ret;
  ptls_buffer_t decbuf;
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  ptls_t *server;
  ptls_t *client;
  ptls_context_t ctx_server;
  size_t i;
  undefined1 auStack_1f8 [8];
  ptls_handshake_properties_t client_prop;
  long local_170;
  size_t client_max_early_data_size;
  ptls_key_exchange_algorithm_t *alternate_keyex [3];
  ptls_context_t ctx_client;
  int mode_local;
  
  memcpy(alternate_keyex + 2,ctx,0x140);
  local_170 = 0;
  client_prop.additional_extensions = (ptls_raw_extension_t *)0x0;
  client_prop.collect_extension =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  client_prop.field_0.server.cookie.additional_data.len = 0;
  client_prop.field_0._96_8_ = 0;
  client_prop.field_0.server.cookie.key = (void *)0x0;
  client_prop.field_0.server.cookie.additional_data.base = (uint8_t *)0x0;
  client_prop.field_0.client.ech.configs.len = 0;
  client_prop.field_0.client.ech.retry_configs = (ptls_iovec_t *)0x0;
  client_prop.field_0._40_8_ = 0;
  client_prop.field_0.client.ech.configs.base = (uint8_t *)0x0;
  client_prop.field_0.client.max_early_data_size = (size_t *)0x0;
  client_prop.field_0.client.negotiated_protocols.count = 0;
  client_prop.field_0.client.session_ticket.base = (uint8_t *)0x0;
  auStack_1f8 = (undefined1  [8])0x0;
  client_prop.field_0.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  client_prop.field_0.client.session_ticket.len = (size_t)&local_170;
  switch(mode) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    if (((ctx_client.get_time)->cb == (_func_uint64_t_st_ptls_get_time_t_ptr *)0x0) ||
       (ctx_client.get_time[1].cb == (_func_uint64_t_st_ptls_get_time_t_ptr *)0x0)) {
      note("keyex mismatch test requires two key exchange algorithms");
      return;
    }
    client_max_early_data_size = (size_t)ctx_client.get_time[1].cb;
    alternate_keyex[0] = (ptls_key_exchange_algorithm_t *)(ctx_client.get_time)->cb;
    alternate_keyex[1] = (ptls_key_exchange_algorithm_t *)0x0;
    break;
  case 4:
    client_prop.field_0.client.max_early_data_size = (size_t *)0x100000000;
    break;
  case -1:
    break;
  default:
    __assert_fail("!\"FIXME\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                  0x67c,"void do_test_pre_shared_key(int)");
  }
  if ((ctx_client.pre_shared_key.identity.base != (uint8_t *)0x0) ||
     (ctx_client.pre_shared_key.secret.base != (uint8_t *)0x0)) {
    __assert_fail("ctx_client.pre_shared_key.identity.len == 0 && ctx_client.pre_shared_key.secret.len == 0"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                  0x680,"void do_test_pre_shared_key(int)");
  }
  ptls_iovec_init("",1);
  ptls_iovec_init("hello world",0xb);
  ctx_server.ticket_requests.client.new_session_count = '\0';
  ctx_server.ticket_requests.client.resumption_count = '\0';
  ctx_server.ticket_requests.server.max_count = '\0';
  ctx_server._315_5_ = 0;
  do {
    if (ctx_client.key_exchanges[ctx_server._312_8_] == (ptls_key_exchange_algorithm_t *)0x0) {
LAB_001527b7:
      if (ctx_client.pre_shared_key.secret.len != 0) {
        memcpy(&client,alternate_keyex + 2,0x140);
        if (mode == -1) {
          ctx_server.hkdf_label_prefix__obsolete._0_1_ =
               (byte)ctx_server.hkdf_label_prefix__obsolete & 0xfe | 1;
        }
        else if (mode == 2) {
          ctx_server.get_time = (ptls_get_time_t *)0x0;
        }
        tls = ptls_new((ptls_context_t *)(alternate_keyex + 2),0);
        tls_00 = ptls_new((ptls_context_t *)&client,1);
        ptls_buffer_init((ptls_buffer_t *)&sbuf.is_allocated,"",0);
        ptls_buffer_init((ptls_buffer_t *)&decbuf.is_allocated,"",0);
        ptls_buffer_init((ptls_buffer_t *)auStack_3d0,"",0);
        consumed._4_4_ =
             ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                            (ptls_handshake_properties_t *)auStack_1f8);
        _ok((uint)(consumed._4_4_ == 0x202),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x69f);
        _ok((uint)(client_prop.field_0._32_4_ == 0),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6a0);
        _ok((uint)(local_170 == -1),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6a1);
        consumed._4_4_ = ptls_send(tls,(ptls_buffer_t *)&sbuf.is_allocated,"hello",5);
        _ok((uint)(consumed._4_4_ == 0),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6a3);
        local_3e0 = cbuf.capacity;
        consumed._4_4_ =
             ptls_handshake(tls_00,(ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                            &local_3e0,(ptls_handshake_properties_t *)0x0);
        if (mode < 0) {
          _ok((uint)(consumed._4_4_ == 0x28),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6a9);
        }
        else {
          _ok((uint)(local_3e0 <= cbuf.capacity),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6ac);
          memmove((void *)sbuf._24_8_,(void *)(sbuf._24_8_ + local_3e0),cbuf.capacity - local_3e0);
          sVar2 = cbuf.capacity - local_3e0;
          if (mode < 3) {
            _ok((uint)(consumed._4_4_ == 0),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6be)
            ;
            local_3e0 = sVar2;
            consumed._4_4_ =
                 ptls_receive(tls_00,(ptls_buffer_t *)auStack_3d0,(void *)sbuf._24_8_,&local_3e0);
            _ok((uint)(consumed._4_4_ == 0),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6c2)
            ;
            _ok((uint)(local_3e0 == sVar2),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6c3)
            ;
            _ok((uint)(decbuf.capacity == 5),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6c5)
            ;
            iVar1 = memcmp(_auStack_3d0,"hello",5);
            _ok((uint)(iVar1 == 0),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6c6)
            ;
            decbuf.capacity = 0;
          }
          else {
            _ok((uint)(consumed._4_4_ == 0x202),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6b0)
            ;
            _ok((uint)(sVar2 == 0),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6b1)
            ;
            local_3e0 = sbuf.capacity;
            consumed._4_4_ =
                 ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                                &local_3e0,(ptls_handshake_properties_t *)auStack_1f8);
            _ok((uint)(consumed._4_4_ == 0x202),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6b4)
            ;
            _ok((uint)(client_prop.field_0._32_4_ == 1),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6b5)
            ;
            _ok((uint)(local_3e0 == sbuf.capacity),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6b6)
            ;
            sbuf.capacity = 0;
            local_3e0 = sVar2;
            consumed._4_4_ =
                 ptls_handshake(tls_00,(ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                                &local_3e0,(ptls_handshake_properties_t *)0x0);
            _ok((uint)(consumed._4_4_ == 0),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6ba)
            ;
            _ok((uint)(local_3e0 == sVar2),"%s %d",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6bb)
            ;
          }
          consumed._4_4_ = ptls_send(tls_00,(ptls_buffer_t *)&decbuf.is_allocated,"hi",2);
          _ok((uint)(consumed._4_4_ == 0),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6cc);
          local_3e0 = sbuf.capacity;
          consumed._4_4_ =
               ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                              &local_3e0,(ptls_handshake_properties_t *)auStack_1f8);
          _ok((uint)(consumed._4_4_ == 0),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6d1);
          iVar1 = 1;
          if (mode < 3) {
            iVar1 = 2;
          }
          _ok((uint)(client_prop.field_0._32_4_ == iVar1),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6d2);
          _ok((uint)(local_3e0 < sbuf.capacity),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6d3);
          memmove((void *)decbuf._24_8_,(void *)(decbuf._24_8_ + local_3e0),
                  sbuf.capacity - local_3e0);
          local_3e0 = sbuf.capacity - local_3e0;
          sbuf.capacity = local_3e0;
          consumed._4_4_ =
               ptls_receive(tls,(ptls_buffer_t *)auStack_3d0,(void *)decbuf._24_8_,&local_3e0);
          _ok((uint)(consumed._4_4_ == 0),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6da);
          _ok((uint)(local_3e0 == sbuf.capacity),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6db);
          sbuf.capacity = 0;
          _ok((uint)(decbuf.capacity == 2),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6dd);
          _ok((uint)(*_auStack_3d0 == 0x6968),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6de);
          decbuf.capacity = 0;
          consumed._4_4_ = ptls_send(tls,(ptls_buffer_t *)&sbuf.is_allocated,"bye",3);
          _ok((uint)(consumed._4_4_ == 0),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6e3);
          iVar1 = ptls_handshake_is_complete(tls_00);
          _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6e6);
          local_3e0 = 0;
          consumed._4_4_ =
               ptls_receive(tls_00,(ptls_buffer_t *)auStack_3d0,(void *)sbuf._24_8_,&local_3e0);
          _ok((uint)(consumed._4_4_ == 0),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6e9);
          iVar1 = ptls_handshake_is_complete(tls_00);
          _ok(iVar1,"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6ea);
          _ok((uint)(local_3e0 == 0),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6eb);
          _ok((uint)(decbuf.capacity == 3),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6ed);
          iVar1 = memcmp(_auStack_3d0,"bye",3);
          _ok((uint)(iVar1 == 0),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x6ee);
        }
        ptls_buffer_dispose((ptls_buffer_t *)&sbuf.is_allocated);
        ptls_buffer_dispose((ptls_buffer_t *)&decbuf.is_allocated);
        ptls_buffer_dispose((ptls_buffer_t *)auStack_3d0);
        ptls_free(tls);
        ptls_free(tls_00);
        return;
      }
      __assert_fail("ctx_client.pre_shared_key.hash != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                    0x689,"void do_test_pre_shared_key(int)");
    }
    iVar1 = strcmp(*(char **)ctx_client.key_exchanges[ctx_server._312_8_]->exchange,"sha256");
    if (iVar1 == 0) {
      ctx_client.pre_shared_key.secret.len =
           (size_t)ctx_client.key_exchanges[ctx_server._312_8_]->exchange;
      goto LAB_001527b7;
    }
    ctx_server._312_8_ = ctx_server._312_8_ + 1;
  } while( true );
}

Assistant:

static void do_test_pre_shared_key(int mode)
{
    ptls_context_t ctx_client = *ctx;
    ptls_key_exchange_algorithm_t *alternate_keyex[3];
    size_t client_max_early_data_size = 0;
    ptls_handshake_properties_t client_prop = {.client.max_early_data_size = &client_max_early_data_size};

    switch (mode) {
    case 0: /* no keyex */
        ctx_client.key_exchanges = NULL;
        break;
    case 1: /* keyex match */
        break;
    case 2: /* server has no keyex */
        break;
    case 3: /* keyex mismatch */
        if (!(ctx_client.key_exchanges[0] != NULL && ctx_client.key_exchanges[1] != NULL)) {
            note("keyex mismatch test requires two key exchange algorithms");
            return;
        }
        alternate_keyex[0] = ctx_client.key_exchanges[1];
        alternate_keyex[1] = ctx_client.key_exchanges[0];
        alternate_keyex[2] = NULL;
        ctx_client.key_exchanges = alternate_keyex;
        break;
    case 4: /* negotiate */
        client_prop.client.negotiate_before_key_exchange = 1;
        break;
    case -1: /* fail:requires-psk-dhe */
        ctx_client.key_exchanges = NULL;
        break;
    default:
        assert(!"FIXME");
    }

    ctx_client.max_early_data_size = 16384;
    assert(ctx_client.pre_shared_key.identity.len == 0 && ctx_client.pre_shared_key.secret.len == 0);
    ctx_client.pre_shared_key.identity = ptls_iovec_init("", 1);
    ctx_client.pre_shared_key.secret = ptls_iovec_init("hello world", 11);
    for (size_t i = 0; ctx_client.cipher_suites[i] != NULL; ++i) {
        if (strcmp(ctx_client.cipher_suites[i]->hash->name, "sha256") == 0) {
            ctx_client.pre_shared_key.hash = ctx_client.cipher_suites[i]->hash;
            break;
        }
    }
    assert(ctx_client.pre_shared_key.hash != NULL);

    ptls_context_t ctx_server = ctx_client;
    switch (mode) {
    case 2: /* server has no keyex */
        ctx_server.key_exchanges = NULL;
        break;
    case -1: /* fail:requires-psk-dhe */
        ctx_server.require_dhe_on_psk = 1;
        break;
    default:
        break;
    }

    ptls_t *client = ptls_new(&ctx_client, 0), *server = ptls_new(&ctx_server, 1);
    ptls_buffer_t cbuf, sbuf, decbuf;
    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(&sbuf, "", 0);
    ptls_buffer_init(&decbuf, "", 0);

    /* [client] send CH and early data */
    int ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_prop.client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
    ok(client_max_early_data_size == SIZE_MAX);
    ret = ptls_send(client, &cbuf, "hello", 5);
    ok(ret == 0);

    /* [server] read CH and generate up to ServerFinished */
    size_t consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    if (mode < 0) {
        ok(ret == PTLS_ALERT_HANDSHAKE_FAILURE);
        goto Exit;
    }
    ok(consumed <= cbuf.off);
    memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
    cbuf.off -= consumed;
    if (mode >= 3) {
        ok(ret == PTLS_ERROR_IN_PROGRESS);
        ok(cbuf.off == 0);
        consumed = sbuf.off;
        ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, &client_prop);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
        ok(client_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
        ok(consumed == sbuf.off);
        sbuf.off = 0;
        consumed = cbuf.off;
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    } else {
        ok(ret == 0);
        /* [server] read early data */
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        cbuf.off = 0;
        ok(decbuf.off == 5);
        ok(memcmp(decbuf.base, "hello", 5) == 0);
        decbuf.off = 0;
    }

    /* [server] write 0.5-RTT data */
    ret = ptls_send(server, &sbuf, "hi", 2);
    ok(ret == 0);

    /* [client] read up to ServerFinished */
    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, &client_prop);
    ok(ret == 0);
    ok(client_prop.client.early_data_acceptance == (mode < 3 ? PTLS_EARLY_DATA_ACCEPTED : PTLS_EARLY_DATA_REJECTED));
    ok(consumed < sbuf.off);
    memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
    sbuf.off -= consumed;

    /* [client] read 0.5-RTT data */
    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    sbuf.off = 0;
    ok(decbuf.off == 2);
    ok(memcmp(decbuf.base, "hi", 2) == 0);
    decbuf.off = 0;

    /* [client] write 1-RTT data */
    ret = ptls_send(client, &cbuf, "bye", 3);
    ok(ret == 0);

    /* [server] read ClientFinished and 1-RTT data */
    ok(!ptls_handshake_is_complete(server));
    consumed = cbuf.off;
    ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));
    ok(consumed == cbuf.off);
    cbuf.off = 0;
    ok(decbuf.off == 3);
    ok(memcmp(decbuf.base, "bye", 3) == 0);

Exit:
    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);
}